

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

iterator __thiscall
QMap<QSettingsKey,_QVariant>::lowerBound(QMap<QSettingsKey,_QVariant> *this,QSettingsKey *key)

{
  bool bVar1;
  long in_FS_OFFSET;
  QMap<QSettingsKey,_QVariant> copy;
  iterator in_stack_ffffffffffffff98;
  QMap<QSettingsKey,_QVariant> *in_stack_ffffffffffffffa0;
  undefined1 *local_18;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffffa0->d);
  if (bVar1) {
    QMap(in_stack_ffffffffffffffa0,(QMap<QSettingsKey,_QVariant> *)in_stack_ffffffffffffff98._M_node
        );
  }
  else {
    memset(&local_18,0,8);
    QMap((QMap<QSettingsKey,_QVariant> *)0x7b92ad);
  }
  detach(in_stack_ffffffffffffffa0);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>_>
                *)0x7b92c3);
  std::
  map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>
  ::lower_bound((map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>
                 *)in_stack_ffffffffffffff98._M_node,(key_type *)0x7b92d4);
  iterator::iterator((iterator *)0x7b92f4,in_stack_ffffffffffffff98);
  ~QMap((QMap<QSettingsKey,_QVariant> *)0x7b9300);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)(iterator)local_10._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator lowerBound(const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        return iterator(d->m.lower_bound(key));
    }